

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_state_machine.hxx
# Opt level: O0

void __thiscall
echo_state_machine::create_snapshot(echo_state_machine *this,snapshot *s,handler_type *when_done)

{
  function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *this_00;
  ulong uVar1;
  ostream *poVar2;
  void *this_01;
  snapshot *in_RSI;
  bool ret;
  ptr<std::exception> except;
  ptr<buffer> snp_buf;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffff68;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff70;
  shared_ptr<nuraft::snapshot> *this_02;
  bool *__args;
  bool local_60 [24];
  snapshot *in_stack_ffffffffffffffb8;
  
  this_00 = (function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *)
            std::operator<<((ostream *)&std::cout,"create snapshot ");
  uVar1 = nuraft::snapshot::get_last_log_idx(in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(this_00,uVar1);
  poVar2 = std::operator<<(poVar2," term ");
  uVar1 = nuraft::snapshot::get_last_log_term(in_RSI);
  this_01 = (void *)std::ostream::operator<<(poVar2,uVar1);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  nuraft::snapshot::serialize(in_stack_ffffffffffffffb8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_ffffffffffffff70);
  nuraft::snapshot::deserialize((buffer *)poVar2);
  this_02 = (shared_ptr<nuraft::snapshot> *)(local_60 + 0x10);
  std::shared_ptr<nuraft::snapshot>::operator=
            (this_02,(shared_ptr<nuraft::snapshot> *)in_stack_ffffffffffffff68);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x18bc9d);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x18bca7);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x18bcb1);
  __args = local_60;
  std::shared_ptr<std::exception>::shared_ptr
            ((shared_ptr<std::exception> *)this_02,in_stack_ffffffffffffff68);
  std::function<void_(bool_&,_std::shared_ptr<std::exception>_&)>::operator()
            (this_00,__args,(shared_ptr<std::exception> *)this_02);
  std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x18bcec);
  return;
}

Assistant:

void create_snapshot(snapshot& s,
                         async_result<bool>::handler_type& when_done)
    {
        std::cout << "create snapshot " << s.get_last_log_idx()
                  << " term " << s.get_last_log_term() << std::endl;
        // Clone snapshot from `s`.
        {   std::lock_guard<std::mutex> l(last_snapshot_lock_);
            ptr<buffer> snp_buf = s.serialize();
            last_snapshot_ = snapshot::deserialize(*snp_buf);
        }
        ptr<std::exception> except(nullptr);
        bool ret = true;
        when_done(ret, except);
    }